

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O0

Mat * bgr_to_grey(Mat *bgr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  Vec<unsigned_char,_3> *pVVar4;
  byte *pbVar5;
  uchar *puVar6;
  Mat *in_RSI;
  uchar b;
  uchar g;
  int local_3c;
  int iStack_38;
  uchar r;
  int x;
  int y;
  int local_2c;
  int local_28;
  int local_24;
  int height;
  int local_1c;
  Mat *pMStack_18;
  int width;
  Mat *bgr_local;
  Mat *grey;
  
  pMStack_18 = in_RSI;
  bgr_local = bgr;
  cv::MatSize::operator()((MatSize *)&local_24);
  local_1c = local_24;
  cv::MatSize::operator()((MatSize *)&y);
  local_28 = local_2c;
  cv::Mat::Mat(bgr,local_2c,local_1c,0);
  for (iStack_38 = 0; iStack_38 < local_28; iStack_38 = iStack_38 + 1) {
    for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
      pVVar4 = cv::Mat::at<cv::Vec<unsigned_char,3>>(pMStack_18,iStack_38,local_3c);
      pbVar5 = cv::Vec<unsigned_char,_3>::operator[](pVVar4,2);
      bVar1 = *pbVar5;
      pVVar4 = cv::Mat::at<cv::Vec<unsigned_char,3>>(pMStack_18,iStack_38,local_3c);
      pbVar5 = cv::Vec<unsigned_char,_3>::operator[](pVVar4,1);
      bVar2 = *pbVar5;
      pVVar4 = cv::Mat::at<cv::Vec<unsigned_char,3>>(pMStack_18,iStack_38,local_3c);
      pbVar5 = cv::Vec<unsigned_char,_3>::operator[](pVVar4,0);
      bVar3 = *pbVar5;
      puVar6 = cv::Mat::at<unsigned_char>(bgr,iStack_38,local_3c);
      *puVar6 = (char)(int)((double)bVar1 * 0.333) + (char)(int)((double)bVar2 * 0.333) +
                (char)(int)((double)bVar3 * 0.333);
    }
  }
  return bgr;
}

Assistant:

Mat
bgr_to_grey(const Mat& bgr)
{
    int width = bgr.size().width;
    int height = bgr.size().height;
    Mat grey(height, width, 0);

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            uchar r = 0.333 * bgr.at<Vec3b>(y, x)[2];
            uchar g = 0.333 * bgr.at<Vec3b>(y, x)[1];
            uchar b = 0.333 * bgr.at<Vec3b>(y, x)[0];
            grey.at<uchar>(y, x) = uchar(r + g + b);
        }
    }

    return grey;
}